

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_ssm_conv(ggml_context *ctx,ggml_tensor *sx,ggml_tensor *c)

{
  long ne0;
  _Bool _Var1;
  long ne2;
  ggml_tensor *pgVar2;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  int64_t n_s;
  int64_t n_t;
  int64_t d_inner;
  int64_t d_conv;
  
  _Var1 = ggml_is_3d(in_RSI);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11b5,"GGML_ASSERT(%s) failed","ggml_is_3d(sx)");
  }
  _Var1 = ggml_is_matrix(in_RDX);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11b6,"GGML_ASSERT(%s) failed","ggml_is_matrix(c)");
  }
  ne0 = in_RDX->ne[0];
  ne2 = (in_RSI->ne[0] - ne0) + 1;
  if (in_RSI->ne[0] != ne0 + -1 + ne2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11bf,"GGML_ASSERT(%s) failed","sx->ne[0] == d_conv - 1 + n_t");
  }
  if (in_RSI->ne[1] != in_RDX->ne[1]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11c0,"GGML_ASSERT(%s) failed","sx->ne[1] == d_inner");
  }
  if (ne2 < 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11c1,"GGML_ASSERT(%s) failed","n_t >= 0");
  }
  pgVar2 = ggml_new_tensor_3d((ggml_context *)in_RSI,(ggml_type)((ulong)in_RDX >> 0x20),ne0,
                              in_RDX->ne[1],ne2);
  pgVar2->op = GGML_OP_SSM_CONV;
  pgVar2->src[0] = in_RSI;
  pgVar2->src[1] = in_RDX;
  return pgVar2;
}

Assistant:

struct ggml_tensor * ggml_ssm_conv(
        struct ggml_context * ctx,
        struct ggml_tensor  * sx,
        struct ggml_tensor  * c) {
    GGML_ASSERT(ggml_is_3d(sx));
    GGML_ASSERT(ggml_is_matrix(c));

    const int64_t d_conv  = c->ne[0];
    const int64_t d_inner = c->ne[1];
    const int64_t n_t     = sx->ne[0] - d_conv + 1; // tokens per sequence
    const int64_t n_s     = sx->ne[2];

    // TODO: maybe support other strides than 1?
    // FIXME: this is always true?
    GGML_ASSERT(sx->ne[0] == d_conv - 1 + n_t);
    GGML_ASSERT(sx->ne[1] == d_inner);
    GGML_ASSERT(n_t >= 0);

    struct ggml_tensor * result = ggml_new_tensor_3d(ctx, GGML_TYPE_F32, d_inner, n_t, n_s);

    result->op     = GGML_OP_SSM_CONV;
    result->src[0] = sx;
    result->src[1] = c;

    return result;
}